

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O3

void __thiscall charls::jpeg_stream_reader::read_preset_coding_parameters(jpeg_stream_reader *this)

{
  uint16_t uVar1;
  
  if ((this->segment_data_).size_ == 0xb) {
    uVar1 = read_uint16(this);
    (this->preset_coding_parameters_).maximum_sample_value = (uint)uVar1;
    uVar1 = read_uint16(this);
    (this->preset_coding_parameters_).threshold1 = (uint)uVar1;
    uVar1 = read_uint16(this);
    (this->preset_coding_parameters_).threshold2 = (uint)uVar1;
    uVar1 = read_uint16(this);
    (this->preset_coding_parameters_).threshold3 = (uint)uVar1;
    uVar1 = read_uint16(this);
    (this->preset_coding_parameters_).reset_value = (uint)uVar1;
    return;
  }
  read_preset_coding_parameters();
}

Assistant:

void jpeg_stream_reader::check_segment_size(const size_t expected_size) const
{
    if (UNLIKELY(expected_size != segment_data_.size()))
        throw_jpegls_error(jpegls_errc::invalid_marker_segment_size);
}